

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opbehavior.cc
# Opt level: O0

uintb __thiscall
OpBehavior::recoverInputBinary
          (OpBehavior *this,int4 slot,int4 sizeout,uintb out,int4 sizein,uintb in)

{
  LowlevelError *this_00;
  allocator local_51;
  string local_50 [32];
  uintb local_30;
  uintb in_local;
  uintb uStack_20;
  int4 sizein_local;
  uintb out_local;
  int4 sizeout_local;
  int4 slot_local;
  OpBehavior *this_local;
  
  local_30 = in;
  in_local._4_4_ = sizein;
  uStack_20 = out;
  out_local._0_4_ = sizeout;
  out_local._4_4_ = slot;
  _sizeout_local = this;
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_50,"Cannot recover input parameter without loss of information",&local_51);
  LowlevelError::LowlevelError(this_00,(string *)local_50);
  __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

uintb OpBehavior::recoverInputBinary(int4 slot,int4 sizeout,uintb out,int4 sizein,uintb in) const

{
  throw LowlevelError("Cannot recover input parameter without loss of information");
}